

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::RemoveReadChain(Buffer *this,uint32_t l)

{
  BufferChain *pBVar1;
  uint16_t uVar2;
  BufferChain *bc_1;
  BufferChain *bc;
  BufferChain *pBStack_20;
  uint16_t canReadCount;
  BufferChain *buff;
  uint32_t rlen;
  uint32_t l_local;
  Buffer *this_local;
  
  if (l < this->len) {
    pBStack_20 = this->m_head;
    buff._0_4_ = l;
    while (pBStack_20 != (BufferChain *)0x0 && (uint32_t)buff != 0) {
      uVar2 = BufferChain::GetCanReadCount(pBStack_20);
      if (uVar2 == 0) {
        pBVar1 = pBStack_20->nextpkt;
        (*this->_vptr_Buffer[1])(this,pBStack_20);
        this->m_head = pBVar1;
        pBStack_20 = pBVar1;
      }
      else {
        if ((uint32_t)buff < uVar2) {
          pBStack_20->read = pBStack_20->read + (short)(uint32_t)buff;
          break;
        }
        buff._0_4_ = (uint32_t)buff - uVar2;
        pBVar1 = pBStack_20->nextpkt;
        (*this->_vptr_Buffer[1])(this,pBStack_20);
        this->m_head = pBVar1;
        pBStack_20 = pBVar1;
      }
    }
    if (this->m_head == (BufferChain *)0x0) {
      this->m_end = (BufferChain *)0x0;
    }
    this->len = this->len - l;
  }
  else {
    Clear(this);
  }
  return;
}

Assistant:

void Buffer::RemoveReadChain(uint32_t l)
{
    if(l >= len)
    {
        Clear();
        return;
    }
    uint32_t rlen = l;
    for(BufferChain* buff = this->m_head; buff != nullptr && rlen > 0;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            continue;
        }
        if(rlen < canReadCount)
        {
            buff->read += rlen;
            break;
        }
        else
        {
            rlen -= canReadCount;
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
        }
    }
    if(m_head == nullptr)
        m_end = nullptr;

    len -= l;
}